

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

lua_Number luaO_arith(int op,lua_Number v1,lua_Number v2)

{
  double dVar1;
  
  switch(op) {
  case 0:
    return v1 + v2;
  case 1:
    return v1 - v2;
  case 2:
    return v1 * v2;
  case 3:
    return v1 / v2;
  case 4:
    dVar1 = floor(v1 / v2);
    return v1 - dVar1 * v2;
  case 5:
    dVar1 = pow(v1,v2);
    return dVar1;
  case 6:
    return -v1;
  default:
    return 0.0;
  }
}

Assistant:

lua_Number luaO_arith (int op, lua_Number v1, lua_Number v2) {
  switch (op) {
    case LUA_OPADD: return luai_numadd(NULL, v1, v2);
    case LUA_OPSUB: return luai_numsub(NULL, v1, v2);
    case LUA_OPMUL: return luai_nummul(NULL, v1, v2);
    case LUA_OPDIV: return luai_numdiv(NULL, v1, v2);
    case LUA_OPMOD: return luai_nummod(NULL, v1, v2);
    case LUA_OPPOW: return luai_numpow(NULL, v1, v2);
    case LUA_OPUNM: return luai_numunm(NULL, v1);
    default: lua_assert(0); return 0;
  }
}